

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,float f)

{
  bool bVar1;
  uint8_t *dest;
  long lStack_20;
  
  if (this->type_ == FBT_INDIRECT_FLOAT) {
    dest = Indirect(this);
    lStack_20 = 9;
  }
  else {
    if (this->type_ != FBT_FLOAT) {
      return false;
    }
    dest = this->data_;
    lStack_20 = 8;
  }
  bVar1 = MutateF<float>(this,dest,f,(ulong)*(byte *)((long)&this->data_ + lStack_20),BIT_WIDTH_32);
  return bVar1;
}

Assistant:

bool MutateFloat(float f) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, f, parent_width_, BIT_WIDTH_32);
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), f, byte_width_, BIT_WIDTH_32);
    } else {
      return false;
    }
  }